

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O3

UINT32 ay8910_start(void **chip,UINT32 clock,UINT8 ay_type,UINT8 ay_flags)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  ay8910_context *psg;
  void *pvVar4;
  byte bVar5;
  undefined1 uVar6;
  ay_ym_param *paVar7;
  int iVar8;
  ay_ym_param *paVar9;
  undefined1 uVar10;
  long lVar11;
  undefined4 uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double local_128 [33];
  
  pvVar4 = calloc(1,0x2e0);
  if (pvVar4 == (void *)0x0) {
    return 0;
  }
  *chip = pvVar4;
  *(UINT32 *)((long)pvVar4 + 0x2c8) = clock;
  *(UINT8 *)((long)pvVar4 + 0x2cd) = ay_flags;
  *(UINT8 *)((long)pvVar4 + 0x2cc) = ay_type;
  bVar5 = 0x10;
  if ((ay_type & 0xf0) != 0x20) {
    bVar5 = ay_type;
  }
  switch(bVar5) {
  case 0:
  case 3:
  case 4:
    *(undefined2 *)((long)pvVar4 + 0xc) = 0x203;
    break;
  case 1:
    *(undefined2 *)((long)pvVar4 + 0xc) = 0x103;
    break;
  case 2:
    *(undefined1 *)((long)pvVar4 + 0xc) = 3;
    break;
  default:
    *(uint *)((long)pvVar4 + 8) = (uint)(0xf < bVar5);
    *(undefined2 *)((long)pvVar4 + 0xc) = 0x203;
    if (0xf >= bVar5) break;
    goto LAB_0015ed6c;
  case 0x10:
  case 0x11:
    uVar10 = 2;
    uVar6 = 3;
    goto LAB_0015ed5f;
  case 0x12:
  case 0x13:
    uVar6 = 1;
    uVar10 = 0;
LAB_0015ed5f:
    *(undefined4 *)((long)pvVar4 + 8) = 1;
    *(undefined1 *)((long)pvVar4 + 0xc) = uVar6;
    *(undefined1 *)((long)pvVar4 + 0xd) = uVar10;
LAB_0015ed6c:
    uVar10 = 0x1f;
    paVar9 = &ym2149_param_env;
    paVar7 = &ym2149_param;
    uVar12 = 1;
    bVar5 = 0;
    uVar6 = 0;
    goto LAB_0015edc3;
  }
  uVar10 = 0xf;
  bVar5 = 1;
  paVar7 = &ay8910_param;
  uVar12 = 2;
  paVar9 = &ay8910_param;
  uVar6 = 1;
LAB_0015edc3:
  *(undefined4 *)((long)pvVar4 + 0x50) = uVar12;
  *(ay_ym_param **)((long)pvVar4 + 0x58) = paVar7;
  *(ay_ym_param **)((long)pvVar4 + 0x60) = paVar9;
  *(undefined1 *)((long)pvVar4 + 0x54) = uVar6;
  *(undefined1 *)((long)pvVar4 + 0x4c) = uVar10;
  *(undefined4 *)((long)pvVar4 + 0x2b4) = 1000;
  *(undefined8 *)((long)pvVar4 + 0x2ac) = 0x3e8000003e8;
  *(byte *)((long)pvVar4 + 0x2b8) = (byte)~ay_flags >> 6 | 1;
  *(undefined1 *)((long)pvVar4 + 0x2b9) = 3;
  *(byte *)((long)pvVar4 + 0x2ba) = (byte)~ay_flags >> 7 | 2;
  lVar11 = (long)pvVar4 + 0x68;
  lVar13 = (long)pvVar4 + 0x128;
  uVar2 = paVar7->res_count;
  uVar3 = paVar9->res_count;
  lVar14 = 0;
  do {
    iVar8 = *(int *)((long)pvVar4 + lVar14 * 4 + 0x2ac);
    if (0 < (int)uVar2) {
      dVar1 = paVar7->r_down;
      uVar15 = 0;
      dVar17 = 0.0;
      dVar18 = 10.0;
      do {
        dVar16 = 1.0 / paVar7->res[uVar15];
        dVar19 = 1.0 / (double)iVar8 + 1.0 / dVar1 + dVar16;
        if (!(bool)(bVar5 & uVar15 == 0)) {
          dVar20 = 1.0 / paVar7->r_up;
          dVar16 = dVar16 + dVar20;
          dVar19 = dVar19 + dVar20;
        }
        dVar16 = dVar16 / dVar19;
        local_128[uVar15] = dVar16;
        dVar19 = dVar16;
        if (dVar18 <= dVar16) {
          dVar19 = dVar18;
        }
        if (dVar16 <= dVar17) {
          dVar16 = dVar17;
        }
        uVar15 = uVar15 + 1;
        dVar17 = dVar16;
        dVar18 = dVar19;
      } while (uVar2 != uVar15);
      uVar15 = 0;
      do {
        *(int *)(lVar11 + uVar15 * 4) =
             (int)((((local_128[uVar15] - dVar19) / (dVar16 - dVar19)) * 16384.0) / 3.0);
        uVar15 = uVar15 + 1;
      } while (uVar15 < uVar2);
      iVar8 = *(int *)((long)pvVar4 + lVar14 * 4 + 0x2ac);
    }
    if (0 < (int)uVar3) {
      dVar1 = paVar9->r_down;
      dVar16 = 1.0 / paVar9->r_up;
      uVar15 = 0;
      dVar17 = 0.0;
      dVar18 = 10.0;
      do {
        dVar19 = 1.0 / paVar9->res[uVar15];
        dVar19 = (dVar19 + dVar16) / (1.0 / (double)iVar8 + 1.0 / dVar1 + dVar19 + dVar16);
        local_128[uVar15] = dVar19;
        dVar20 = dVar19;
        if (dVar18 <= dVar19) {
          dVar20 = dVar18;
        }
        if (dVar19 <= dVar17) {
          dVar19 = dVar17;
        }
        uVar15 = uVar15 + 1;
        dVar17 = dVar19;
        dVar18 = dVar20;
      } while (uVar3 != uVar15);
      uVar15 = 0;
      do {
        *(int *)(lVar13 + uVar15 * 4) =
             (int)((((local_128[uVar15] - dVar20) / (dVar19 - dVar20)) * 16384.0) / 3.0);
        uVar15 = uVar15 + 1;
      } while (uVar15 < uVar3);
    }
    lVar14 = lVar14 + 1;
    lVar11 = lVar11 + 0x40;
    lVar13 = lVar13 + 0x80;
  } while (lVar14 != 3);
  *(undefined4 *)((long)pvVar4 + 0x2c4) = 0xffffffff;
  *(undefined8 *)((long)pvVar4 + 700) = 0xffffffffffffffff;
  return (*(uint *)((long)pvVar4 + 0x2c8) >> (ay_flags >> 4 & *(int *)((long)pvVar4 + 8) == 1)) >> 3
  ;
}

Assistant:

UINT32 ay8910_start(void **chip, UINT32 clock, UINT8 ay_type, UINT8 ay_flags)
{
	ay8910_context *info;

	info = (ay8910_context*)calloc(1, sizeof(ay8910_context));
	if (info == NULL)
		return 0;
	*chip = info;

	info->SmpRateFunc = NULL;

	info->clock = clock;
	info->chip_flags = ay_flags;
	ay8910_set_type(info, ay_type);
	info->res_load[0] = info->res_load[1] = info->res_load[2] = 1000; //Default values for resistor loads
	
	if (info->chip_flags & AY8910_ZX_STEREO)
	{
		// ABC Stereo
		info->StereoMask[0] = 0x01;
		info->StereoMask[1] = 0x03;
		info->StereoMask[2] = 0x02;
	}
	else
	{
		info->StereoMask[0] = 0x03;
		info->StereoMask[1] = 0x03;
		info->StereoMask[2] = 0x03;
	}

	build_mixer_table(info);

	//ay8910_set_clock(info, clock);
	ay8910_set_mute_mask(info, 0x00);

	return ay8910_get_sample_rate(info);
}